

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O3

FaceData * __thiscall
Ptex::v2_4::PtexReader::TiledFaceBase::reduce
          (TiledFaceBase *this,PtexReader *r,Res newres,ReduceFn *reducefn,size_t *newMemUsed)

{
  Res RVar1;
  DataType DVar2;
  _func_int *p_Var3;
  code *pcVar4;
  long lVar5;
  ReduceFn *pRVar6;
  TiledFaceBase *pTVar7;
  uint uVar8;
  uint32_t uVar9;
  char cVar10;
  int iVar11;
  uint uVar12;
  undefined4 extraout_var;
  void *pvVar14;
  void *__s2;
  TiledFaceBase *pTVar15;
  PtexReader *pPVar16;
  EVP_PKEY_CTX *dst;
  byte bVar17;
  byte bVar18;
  int iVar19;
  int iVar20;
  undefined6 in_register_00000012;
  byte bVar21;
  uint uVar22;
  EVP_PKEY_CTX *src;
  undefined8 *puVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  int iVar27;
  bool bVar28;
  undefined8 uStack_90;
  DataType aDStack_88 [2];
  ulong auStack_80 [2];
  ReduceFn *local_70;
  size_t *local_68;
  TiledFaceBase *local_60;
  undefined8 *local_58;
  int local_4c;
  int local_48;
  uint local_44;
  uint local_40;
  int local_3c;
  uint local_38;
  uint32_t local_34;
  long *plVar13;
  
  bVar18 = newres.vlog2;
  local_34 = (r->_header).meshtype;
  bVar17 = newres.ulog2;
  local_40 = (uint)bVar18;
  local_3c = (int)CONCAT62(in_register_00000012,newres);
  uVar22 = local_40;
  bVar21 = bVar17;
  if (local_34 != 0) {
    RVar1 = this->_tileres;
    bVar21 = RVar1.ulog2;
    if ((char)bVar17 <= RVar1.ulog2) {
      bVar21 = bVar17;
    }
    uVar22 = (uint)((ushort)RVar1 >> 8);
    if ((char)bVar18 <= RVar1.vlog2) {
      uVar22 = (uint)bVar18;
    }
  }
  if ((1 << (bVar17 - bVar21 & 0x1f)) << (bVar18 - (char)uVar22 & 0x1f) == 1) {
    lVar5 = -((long)this->_ntiles * 8 + 0xfU & 0xfffffffffffffff0);
    local_58 = (undefined8 *)((long)auStack_80 + lVar5 + 8);
    local_70 = reducefn;
    local_68 = newMemUsed;
    if (0 < (long)this->_ntiles) {
      bVar28 = true;
      uVar25 = 0;
      do {
        while( true ) {
          p_Var3 = (this->super_FaceData).super_PtexFaceData._vptr_PtexFaceData[9];
          *(undefined8 *)((long)auStack_80 + lVar5) = 0x107dd0;
          iVar11 = (*p_Var3)(this,uVar25 & 0xffffffff);
          puVar23 = local_58;
          plVar13 = (long *)CONCAT44(extraout_var,iVar11);
          local_58[uVar25] = plVar13;
          if (bVar28) break;
LAB_00107e20:
          bVar28 = false;
LAB_00107e23:
          iVar19 = local_3c;
          uVar25 = uVar25 + 1;
          iVar11 = this->_ntiles;
          if ((long)iVar11 <= (long)uVar25) {
            if (!bVar28) {
              if (local_34 == 0) {
                bVar21 = (this->_tileres).ulog2;
                bVar17 = (this->_tileres).vlog2;
                local_4c = 1 << (bVar21 & 0x1f);
                local_34 = 1 << (bVar17 & 0x1f);
                local_38 = this->_pixelsize;
                uVar22 = local_38 << (bVar21 & 0x1f);
                iVar19 = this->_ntilesu;
                local_48 = uVar22 * iVar19;
                iVar27 = local_48 << (bVar17 & 0x1f);
                iVar24 = local_4c << (bVar17 & 0x1f);
                iVar20 = local_38 * iVar11;
                *(undefined8 *)((long)auStack_80 + lVar5) = 0x108114;
                pTVar15 = (TiledFaceBase *)operator_new__((long)(iVar20 * iVar24));
                local_60 = pTVar15;
                if (0 < iVar11) {
                  local_38 = iVar27 - (iVar19 + -1) * uVar22;
                  uVar25 = 0;
                  local_44 = uVar22;
                  do {
                    plVar13 = (long *)local_58[uVar25];
                    pcVar4 = *(code **)(*plVar13 + 0x18);
                    *(undefined8 *)((long)auStack_80 + lVar5) = 0x108151;
                    cVar10 = (*pcVar4)(plVar13);
                    pcVar4 = *(code **)(*plVar13 + 0x30);
                    *(undefined8 *)((long)auStack_80 + lVar5) = 0x10815d;
                    dst = (EVP_PKEY_CTX *)(*pcVar4)(plVar13);
                    uVar9 = local_34;
                    uVar22 = local_44;
                    iVar19 = local_48;
                    iVar11 = local_4c;
                    if (cVar10 == '\0') {
                      src = (EVP_PKEY_CTX *)(ulong)local_44;
                      *(undefined8 *)((long)auStack_80 + lVar5) = 0x10819d;
                      PtexUtils::copy(dst,src);
                    }
                    else {
                      iVar24 = this->_pixelsize;
                      *(undefined8 *)((long)auStack_80 + lVar5) = 0x10817b;
                      PtexUtils::fill(dst,pTVar15,iVar19,iVar11,uVar9,iVar24);
                      uVar22 = local_44;
                    }
                    uVar25 = uVar25 + 1;
                    uVar12 = local_38;
                    if ((int)((long)((ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 |
                                    uVar25 & 0xffffffff) % (long)this->_ntilesu) != 0) {
                      uVar12 = uVar22;
                    }
                    pTVar15 = (TiledFaceBase *)
                              ((long)&(pTVar15->super_FaceData).super_PtexFaceData.
                                      _vptr_PtexFaceData + (long)(int)uVar12);
                  } while ((long)uVar25 < (long)this->_ntiles);
                  local_38 = this->_pixelsize;
                }
                uVar22 = local_38;
                iVar11 = local_3c;
                bVar18 = (byte)local_3c;
                iVar19 = ((1 << (bVar18 & 0x1f)) << ((byte)local_40 & 0x1f)) * local_38;
                *(undefined8 *)((long)auStack_80 + lVar5) = 0x1081f2;
                pTVar15 = (TiledFaceBase *)operator_new(0x18);
                (pTVar15->super_FaceData)._res = SUB42(iVar11,0);
                (pTVar15->super_FaceData).super_PtexFaceData._vptr_PtexFaceData =
                     (_func_int **)&PTR__PackedFace_0011d600;
                *(uint *)&(pTVar15->super_FaceData).field_0xc = uVar22;
                uVar25 = (ulong)iVar19;
                *(undefined8 *)((long)auStack_80 + lVar5) = 0x108215;
                pPVar16 = (PtexReader *)operator_new__(uVar25);
                pTVar7 = local_60;
                pTVar15->_reader = pPVar16;
                *local_68 = uVar25 + 0x18;
                bVar21 = (this->super_FaceData)._res.ulog2;
                bVar17 = (this->super_FaceData)._res.vlog2;
                iVar11 = local_38 << (bVar21 & 0x1f);
                iVar19 = local_38 << (bVar18 & 0x1f);
                DVar2 = this->_dt;
                *(ulong *)((long)auStack_80 + lVar5) = (ulong)(uint)this->_nchan;
                *(ulong *)((long)aDStack_88 + lVar5) = (ulong)DVar2;
                pRVar6 = local_70;
                *(undefined8 *)((long)&uStack_90 + lVar5) = 0x10826c;
                (*pRVar6)(pTVar7,iVar11,1 << (bVar21 & 0x1f),1 << (bVar17 & 0x1f),pPVar16,iVar19,
                          *(DataType *)((long)aDStack_88 + lVar5),*(int *)((long)auStack_80 + lVar5)
                         );
                *(undefined8 *)((long)auStack_80 + lVar5) = 0x108278;
                operator_delete__(pTVar7);
                puVar23 = local_58;
                goto LAB_00107f02;
              }
              local_48 = 1 << ((byte)local_3c & 0x1f);
              local_34 = this->_pixelsize;
              iVar24 = (local_48 << ((byte)local_40 & 0x1f)) * local_34;
              *(undefined8 *)((long)auStack_80 + lVar5) = 0x107f6c;
              pTVar15 = (TiledFaceBase *)operator_new(0x18);
              (pTVar15->super_FaceData)._res = SUB42(iVar19,0);
              (pTVar15->super_FaceData).super_PtexFaceData._vptr_PtexFaceData =
                   (_func_int **)&PTR__PackedFace_0011d600;
              *(uint32_t *)&(pTVar15->super_FaceData).field_0xc = local_34;
              uVar25 = (ulong)iVar24;
              *(undefined8 *)((long)auStack_80 + lVar5) = 0x107f91;
              pPVar16 = (PtexReader *)operator_new__(uVar25);
              pTVar15->_reader = pPVar16;
              *local_68 = uVar25 + 0x18;
              bVar21 = (this->_tileres).ulog2;
              local_44 = 1 << (bVar21 & 0x1f);
              local_38 = 1 << ((this->_tileres).vlog2 & 0x1fU);
              uVar22 = local_34 << (bVar21 & 0x1f);
              local_34 = local_34 << ((byte)local_3c & 0x1f);
              local_4c = (int)local_34 / this->_ntilesu;
              if (iVar11 < 1) {
                return &pTVar15->super_FaceData;
              }
              local_68 = (size_t *)CONCAT44(local_68._4_4_,1 << ((byte)local_40 & 0x1f));
              local_3c = (int)(local_34 << ((byte)local_40 & 0x1f)) / this->_ntilesv -
                         (this->_ntilesu + -1) * local_4c;
              uVar25 = 0;
              local_60 = pTVar15;
              local_40 = uVar22;
              do {
                plVar13 = (long *)local_58[uVar25];
                pcVar4 = *(code **)(*plVar13 + 0x18);
                *(undefined8 *)((long)auStack_80 + lVar5) = 0x10802f;
                cVar10 = (*pcVar4)(plVar13);
                pcVar4 = *(code **)(*plVar13 + 0x30);
                *(undefined8 *)((long)auStack_80 + lVar5) = 0x10803c;
                pvVar14 = (void *)(*pcVar4)(plVar13);
                uVar9 = local_34;
                uVar8 = local_38;
                uVar12 = local_40;
                uVar22 = local_44;
                if (cVar10 == '\0') {
                  DVar2 = this->_dt;
                  *(ulong *)((long)auStack_80 + lVar5) = (ulong)(uint)this->_nchan;
                  *(ulong *)((long)aDStack_88 + lVar5) = (ulong)DVar2;
                  pRVar6 = local_70;
                  *(undefined8 *)((long)&uStack_90 + lVar5) = 0x108085;
                  (*pRVar6)(pvVar14,uVar12,uVar22,uVar8,pPVar16,uVar9,
                            *(DataType *)((long)aDStack_88 + lVar5),
                            *(int *)((long)auStack_80 + lVar5));
                }
                else {
                  iVar19 = local_48 / this->_ntilesu;
                  iVar24 = (int)local_68 / this->_ntilesv;
                  iVar11 = this->_pixelsize;
                  *(undefined8 *)((long)auStack_80 + lVar5) = 0x108066;
                  PtexUtils::fill(pvVar14,pPVar16,uVar9,iVar19,iVar24,iVar11);
                }
                uVar25 = uVar25 + 1;
                iVar11 = local_3c;
                if ((int)((long)((ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 | uVar25 & 0xffffffff) %
                         (long)this->_ntilesu) != 0) {
                  iVar11 = local_4c;
                }
                pPVar16 = (PtexReader *)
                          ((long)&(pPVar16->super_PtexTexture)._vptr_PtexTexture + (long)iVar11);
                iVar11 = this->_ntiles;
                puVar23 = local_58;
                pTVar15 = local_60;
              } while ((long)uVar25 < (long)iVar11);
              goto LAB_00107f05;
            }
            goto LAB_00107e99;
          }
        }
        pcVar4 = *(code **)(*plVar13 + 0x18);
        *(undefined8 *)((long)auStack_80 + lVar5) = 0x107dea;
        cVar10 = (*pcVar4)(plVar13);
        if (cVar10 == '\0') goto LAB_00107e20;
        if (uVar25 != 0) {
          pcVar4 = *(code **)(*(long *)*puVar23 + 0x30);
          *(undefined8 *)((long)auStack_80 + lVar5) = 0x107dfd;
          pvVar14 = (void *)(*pcVar4)();
          pcVar4 = *(code **)(*plVar13 + 0x30);
          *(undefined8 *)((long)auStack_80 + lVar5) = 0x107e09;
          __s2 = (void *)(*pcVar4)(plVar13);
          iVar11 = this->_pixelsize;
          *(undefined8 *)((long)auStack_80 + lVar5) = 0x107e18;
          iVar11 = bcmp(pvVar14,__s2,(long)iVar11);
          bVar28 = iVar11 == 0;
          goto LAB_00107e23;
        }
        uVar25 = 1;
        bVar28 = true;
      } while (1 < this->_ntiles);
    }
LAB_00107e99:
    *(undefined8 *)((long)auStack_80 + lVar5) = 0x107ea3;
    pTVar15 = (TiledFaceBase *)operator_new(0x18);
    iVar11 = this->_pixelsize;
    (pTVar15->super_FaceData)._res.ulog2 = '\0';
    (pTVar15->super_FaceData)._res.vlog2 = '\0';
    (pTVar15->super_FaceData).super_PtexFaceData._vptr_PtexFaceData =
         (_func_int **)&PTR__PackedFace_0011d600;
    *(int *)&(pTVar15->super_FaceData).field_0xc = iVar11;
    *(undefined8 *)((long)auStack_80 + lVar5) = 0x107ec3;
    pPVar16 = (PtexReader *)operator_new__((long)iVar11);
    puVar23 = local_58;
    pTVar15->_reader = pPVar16;
    (pTVar15->super_FaceData).super_PtexFaceData._vptr_PtexFaceData =
         (_func_int **)&PTR__PackedFace_0011d680;
    pcVar4 = *(code **)(*(long *)*local_58 + 0x30);
    *(undefined8 *)((long)auStack_80 + lVar5) = 0x107ee5;
    pvVar14 = (void *)(*pcVar4)();
    iVar11 = this->_pixelsize;
    *(undefined8 *)((long)auStack_80 + lVar5) = 0x107ef7;
    memcpy(pPVar16,pvVar14,(long)iVar11);
    *local_68 = (long)iVar11 + 0x18;
LAB_00107f02:
    iVar11 = this->_ntiles;
LAB_00107f05:
    if (0 < iVar11) {
      lVar26 = 0;
      do {
        pcVar4 = *(code **)(*(long *)puVar23[lVar26] + 0x10);
        *(undefined8 *)((long)auStack_80 + lVar5) = 0x107f16;
        (*pcVar4)();
        lVar26 = lVar26 + 1;
      } while (lVar26 < this->_ntiles);
    }
  }
  else {
    auStack_80[0] = 0x107e53;
    pTVar15 = (TiledFaceBase *)operator_new(0x60);
    auStack_80[0] = 0x107e68;
    TiledFaceBase(pTVar15,this->_reader,SUB42(local_3c,0),
                  (Res)((ushort)(uVar22 << 8) | (ushort)bVar21));
    (pTVar15->super_FaceData).super_PtexFaceData._vptr_PtexFaceData =
         (_func_int **)&PTR__TiledFaceBase_0011d780;
    pTVar15[1].super_FaceData.super_PtexFaceData._vptr_PtexFaceData = (_func_int **)this;
    *(ReduceFn **)&pTVar15[1].super_FaceData._res = reducefn;
    *newMemUsed = (long)(pTVar15->_tiles).
                        super__Vector_base<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish +
                  (0x60 - (long)(pTVar15->_tiles).
                                super__Vector_base<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
  }
  return &pTVar15->super_FaceData;
}

Assistant:

PtexReader::FaceData*
PtexReader::TiledFaceBase::reduce(PtexReader* r, Res newres, PtexUtils::ReduceFn reducefn,
                                  size_t& newMemUsed)
{
    /* Tiled reductions should generally only be anisotropic (just u
       or v, not both) since isotropic reductions are precomputed and
       stored on disk.  (This function should still work for isotropic
       reductions though.)

       In the anisotropic case, the number of tiles should be kept the
       same along the direction not being reduced in order to preserve
       the laziness of the file access.  In contrast, if reductions
       were not tiled, then any reduction would read all the tiles and
       defeat the purpose of tiling.
    */

    // keep new face local until fully initialized
    FaceData* newface = 0;

    // don't tile triangle reductions (too complicated)
    Res newtileres;
    bool isTriangle = r->_header.meshtype == mt_triangle;
    if (isTriangle) {
        newtileres = newres;
    }
    else {
        // propagate the tile res to the reduction
        newtileres = _tileres;
        // but make sure tile isn't larger than the new face!
        if (newtileres.ulog2 > newres.ulog2) newtileres.ulog2 = newres.ulog2;
        if (newtileres.vlog2 > newres.vlog2) newtileres.vlog2 = newres.vlog2;
    }


    // determine how many tiles we will have on the reduction
    int newntiles = newres.ntiles(newtileres);

    if (newntiles == 1) {
        // no need to keep tiling, reduce tiles into a single face
        // first, get all tiles and check if they are constant (with the same value)
        PtexFaceData** tiles = (PtexFaceData**) alloca(_ntiles * sizeof(PtexFaceData*));
        bool allConstant = true;
        for (int i = 0; i < _ntiles; i++) {
            PtexFaceData* tile = tiles[i] = getTile(i);
            allConstant = (allConstant && tile->isConstant() &&
                           (i == 0 || (0 == memcmp(tiles[0]->getData(), tile->getData(),
                                                   _pixelsize))));
        }
        if (allConstant) {
            // allocate a new constant face
            newface = new ConstantFace(_pixelsize);
            memcpy(newface->getData(), tiles[0]->getData(), _pixelsize);
            newMemUsed = sizeof(ConstantFace) + _pixelsize;
        }
        else if (isTriangle) {
            // reassemble all tiles into temporary contiguous image
            // (triangle reduction doesn't work on tiles)
            int tileures = _tileres.u();
            int tilevres = _tileres.v();
            int sstride = _pixelsize * tileures;
            int dstride = sstride * _ntilesu;
            int dstepv = dstride * tilevres - sstride*(_ntilesu-1);

            char* tmp = new char [_ntiles * _tileres.size() * _pixelsize];
            char* tmpptr = tmp;
            for (int i = 0; i < _ntiles;) {
                PtexFaceData* tile = tiles[i];
                if (tile->isConstant())
                    PtexUtils::fill(tile->getData(), tmpptr, dstride,
                                    tileures, tilevres, _pixelsize);
                else
                    PtexUtils::copy(tile->getData(), sstride, tmpptr, dstride, tilevres, sstride);
                i++;
                tmpptr += (i%_ntilesu) ? sstride : dstepv;
            }

            // allocate a new packed face
            int memsize = _pixelsize * newres.size();
            newface = new PackedFace(newres, _pixelsize, memsize);
            newMemUsed = sizeof(PackedFace) + memsize;
            // reduce and copy into new face
            reducefn(tmp, _pixelsize * _res.u(), _res.u(), _res.v(),
                     newface->getData(), _pixelsize * newres.u(), _dt, _nchan);

            delete [] tmp;
        }
        else {
            // allocate a new packed face
            int memsize = _pixelsize * newres.size();
            newface = new PackedFace(newres, _pixelsize, memsize);
            newMemUsed = sizeof(PackedFace) + memsize;

            int tileures = _tileres.u();
            int tilevres = _tileres.v();
            int sstride = _pixelsize * tileures;
            int dstride = _pixelsize * newres.u();
            int dstepu = dstride/_ntilesu;
            int dstepv = dstride*newres.v()/_ntilesv - dstepu*(_ntilesu-1);

            char* dst = (char*) newface->getData();
            for (int i = 0; i < _ntiles;) {
                PtexFaceData* tile = tiles[i];
                if (tile->isConstant())
                    PtexUtils::fill(tile->getData(), dst, dstride,
                                    newres.u()/_ntilesu, newres.v()/_ntilesv,
                                    _pixelsize);
                else
                    reducefn(tile->getData(), sstride, tileures, tilevres,
                             dst, dstride, _dt, _nchan);
                i++;
                dst += (i%_ntilesu) ? dstepu : dstepv;
            }
        }
        // release the tiles
        for (int i = 0; i < _ntiles; i++) tiles[i]->release();
    }
    else {
        // otherwise, tile the reduced face
        TiledReducedFace* tf = new TiledReducedFace(_reader, newres, newtileres, this, reducefn);
        newface = tf;
        newMemUsed = tf->memUsed();
    }
    return newface;
}